

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O1

void __thiscall
QComboBoxPrivateScroller::paintEvent(QComboBoxPrivateScroller *this,QPaintEvent *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  int iVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  QPainter p;
  undefined1 local_e0 [24];
  double local_c8;
  double dStack_c0;
  QStyleOptionMenuItem local_b0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_e0,&(this->super_QWidget).super_QPaintDevice);
  memset(&local_b0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem(&local_b0);
  QStyleOption::initFrom(&local_b0.super_QStyleOption,&this->super_QWidget);
  local_b0.checkType = NotCheckable;
  pQVar5 = (this->super_QWidget).data;
  local_b0.menuRect.x2.m_i = (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i;
  local_b0.menuRect.y2.m_i = (pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i;
  local_b0.menuRect.x1.m_i = 0;
  local_b0.menuRect.y1.m_i = 0;
  local_b0.maxIconWidth = 0;
  local_b0.reservedShortcutWidth = 0;
  local_b0.menuItemType = Scroller;
  if (this->sliderAction == SliderSingleStepAdd) {
    local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
         (byte)local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 0x40;
  }
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar9 = uVar1 - uVar2;
  auVar7._4_4_ = uVar3 - uVar4;
  local_e0._8_16_ = (undefined1  [16])0x0;
  auVar7._8_4_ = auVar7._4_4_;
  auVar7._12_4_ = -(uint)(auVar7._4_4_ < 0);
  auVar8._8_4_ = 0xffffffff;
  auVar8._0_8_ = 0xffffffffffffffff;
  auVar8._12_4_ = 0xffffffff;
  local_c8 = (double)(CONCAT44(-(uint)(iVar9 < 0),iVar9) + 1);
  dStack_c0 = (double)(auVar7._8_8_ - auVar8._8_8_);
  QPainter::eraseRect((QRectF *)local_e0);
  pQVar6 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar6 + 0xb8))(pQVar6,0xf,&local_b0,(QRectF *)local_e0,0);
  QFont::~QFont(&local_b0.font);
  QIcon::~QIcon(&local_b0.icon);
  if (&(local_b0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&local_b0.super_QStyleOption);
  QPainter::~QPainter((QPainter *)local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *) override {
        QPainter p(this);
        QStyleOptionMenuItem menuOpt;
        menuOpt.initFrom(this);
        menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
        menuOpt.menuRect = rect();
        menuOpt.maxIconWidth = 0;
        menuOpt.reservedShortcutWidth = 0;
        menuOpt.menuItemType = QStyleOptionMenuItem::Scroller;
        if (sliderAction == QAbstractSlider::SliderSingleStepAdd)
            menuOpt.state |= QStyle::State_DownArrow;
        p.eraseRect(rect());
        style()->drawControl(QStyle::CE_MenuScroller, &menuOpt, &p);
    }